

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall
anon_unknown.dwarf_145cfbe::InferScript
          (anon_unknown_dwarf_145cfbe *this,CScript *script,ParseScriptContext ctx,
          SigningProvider *provider)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  pointer puVar5;
  uchar *data_00;
  uint uVar6;
  pointer piVar7;
  undefined8 uVar8;
  bool bVar9;
  TxoutType TVar10;
  int iVar11;
  PKDescriptor *pPVar12;
  MultiADescriptor *this_00;
  MultisigDescriptor *this_01;
  CRIPEMD160 *this_02;
  TRDescriptor *this_03;
  MiniscriptDescriptor *this_04;
  AddressDescriptor *this_05;
  RawDescriptor *this_06;
  uint uVar13;
  size_t __n;
  undefined8 uVar14;
  pointer *__ptr;
  long lVar15;
  undefined8 uVar16;
  ulong uVar17;
  _Head_base<0UL,_int,_false> *__args;
  pointer __p;
  Node<unsigned_int> *pNVar18;
  long in_FS_OFFSET;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  key_2;
  vector<int,_std::allocator<int>_> depths;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  subscripts;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  data;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  subdesc;
  CTxDestination dest;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  key_1;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  keys;
  XOnlyPubKey key;
  _Head_base<0UL,_(anonymous_namespace)::TRDescriptor_*,_false> local_1c8;
  PubkeyProvider *local_1c0;
  PubkeyProvider *local_1b8;
  iterator iStack_1b0;
  int *local_1a8;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  local_198;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_178;
  vector<int,_std::allocator<int>_> local_158;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_140;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_138;
  undefined1 local_f0;
  direct_or_indirect local_e8;
  uint local_cc;
  _Storage<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false>
  local_c8;
  char local_b0;
  undefined1 local_a8 [56];
  undefined1 auStack_70 [16];
  _Rb_tree_node_base local_60;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (ctx == P2TR) {
    if ((((script->super_CScriptBase)._size == 0x3f) &&
        (pcVar4 = (script->super_CScriptBase)._union.indirect_contents.indirect, *pcVar4 == ' ')) &&
       (pcVar4[0x21] == -0x54)) {
      local_a8._0_8_ = *(undefined8 *)(pcVar4 + 1);
      local_a8._8_8_ = *(undefined8 *)(pcVar4 + 9);
      local_a8._16_8_ = *(undefined8 *)(pcVar4 + 0x11);
      local_a8._24_8_ = *(undefined8 *)(pcVar4 + 0x19);
      InferXOnlyPubkey((XOnlyPubKey *)&local_e8.indirect_contents,(ParseScriptContext)local_a8,
                       provider);
      pPVar12 = (PKDescriptor *)operator_new(0x60);
      local_138._0_8_ = local_e8.indirect_contents.indirect;
      local_e8.indirect_contents.indirect = (char *)0x0;
      PKDescriptor::PKDescriptor
                (pPVar12,(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                          *)&local_138._M_first,true);
      if ((Node<unsigned_int> *)local_138._0_8_ != (Node<unsigned_int> *)0x0) {
        local_c8._M_value.
        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pPVar12;
        (*(*(_func_int ***)local_138._0_8_)[1])();
      }
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(PKDescriptor **)this = pPVar12;
      std::
      unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                     *)&local_c8._M_value);
      goto LAB_00391457;
    }
    MatchMultiA((optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
                 *)local_a8,script);
    if ((bool)local_a8[0x20] == false) {
      *(undefined8 *)this = 0;
    }
    else {
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::reserve((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)&local_c8._M_value,(long)(local_a8._16_8_ - local_a8._8_8_) >> 4);
      uVar14 = local_a8._16_8_;
      if (local_a8._8_8_ != local_a8._16_8_) {
        pNVar18 = (Node<unsigned_int> *)local_a8._8_8_;
        do {
          if ((pNVar18->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x20) {
            *(undefined8 *)this = 0;
            goto LAB_0039049d;
          }
          memmove(&local_138,*(_func_int ***)pNVar18,0x20);
          InferXOnlyPubkey((XOnlyPubKey *)&local_e8.indirect_contents,(ParseScriptContext)&local_138
                           ,provider);
          uVar16 = local_e8.indirect_contents.indirect;
          if ((Node<unsigned_int> *)local_e8.indirect_contents.indirect == (Node<unsigned_int> *)0x0
             ) {
            *(undefined8 *)this = 0;
          }
          else {
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
            ::
            emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                      ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                        *)&local_c8._M_value,
                       (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        *)&local_e8.indirect_contents);
          }
          if ((Node<unsigned_int> *)local_e8.indirect_contents.indirect != (Node<unsigned_int> *)0x0
             ) {
            (*(*(_func_int ***)local_e8.indirect_contents.indirect)[1])();
          }
          if ((Node<unsigned_int> *)uVar16 == (Node<unsigned_int> *)0x0) goto LAB_0039049d;
          pNVar18 = (Node<unsigned_int> *)
                    &(pNVar18->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        } while (pNVar18 != (Node<unsigned_int> *)uVar14);
      }
      this_00 = (MultiADescriptor *)operator_new(0x60);
      local_138._0_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_138._8_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_138._16_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MultiADescriptor::MultiADescriptor
                (this_00,local_a8._0_4_,
                 (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  *)&local_138._M_first,false);
      local_e8.indirect_contents.indirect = (char *)this_00;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)&local_138._M_first);
      local_e8.indirect_contents.indirect = (char *)0x0;
      *(MultiADescriptor **)this = this_00;
      std::
      unique_ptr<(anonymous_namespace)::MultiADescriptor,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultiADescriptor,_std::default_delete<(anonymous_namespace)::MultiADescriptor>_>
                     *)&local_e8.indirect_contents);
LAB_0039049d:
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)&local_c8._M_value);
    }
    if (((bool)local_a8[0x20] == true) &&
       (local_a8._32_8_ = local_a8._32_8_ & 0xffffffffffffff00,
       (Node<unsigned_int> *)local_a8._8_8_ != (Node<unsigned_int> *)0x0)) {
      operator_delete((void *)local_a8._8_8_,local_a8._24_8_ - local_a8._8_8_);
    }
    if (*(long *)this != 0) goto LAB_00391457;
    *(undefined8 *)this = 0;
  }
  local_178.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar10 = Solver(script,&local_178);
  switch(TVar10) {
  case PUBKEY:
    if ((ctx < P2TR) && (ctx != P2WPKH)) {
      CPubKey::Set<unsigned_char_const*>
                ((CPubKey *)local_a8,
                 ((local_178.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 ((local_178.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      InferPubkey((anon_unknown_dwarf_145cfbe *)&local_c8._M_value,(CPubKey *)local_a8,ctx,provider)
      ;
      if ((Node<unsigned_int> *)
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0) goto LAB_003905fa;
      pPVar12 = (PKDescriptor *)operator_new(0x60);
      local_138._0_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      PKDescriptor::PKDescriptor
                (pPVar12,(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                          *)&local_138._M_first,false);
      if ((Node<unsigned_int> *)local_138._0_8_ != (Node<unsigned_int> *)0x0) {
        local_e8.indirect_contents.indirect = (char *)pPVar12;
        (*(*(_func_int ***)local_138._0_8_)[1])();
      }
      local_e8.indirect_contents.indirect = (char *)0x0;
      *(PKDescriptor **)this = pPVar12;
      std::
      unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                     *)&local_e8.indirect_contents);
      goto LAB_0039144a;
    }
LAB_003905fa:
    if (TVar10 == WITNESS_V0_KEYHASH) goto switchD_00390535_caseD_8;
    if (TVar10 == MULTISIG) goto switchD_00390535_caseD_5;
    if (TVar10 == PUBKEYHASH) goto switchD_00390535_caseD_3;
    break;
  case PUBKEYHASH:
switchD_00390535_caseD_3:
    if ((P2WSH < ctx) || (ctx == P2WPKH)) {
LAB_003906ed:
      if (ctx < P2WPKH && TVar10 == WITNESS_V0_KEYHASH) goto LAB_00390702;
      goto LAB_003907d5;
    }
    puVar5 = ((local_178.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((local_178.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar5 != 0x14) goto LAB_003914ac;
    memcpy(&local_138,puVar5,0x14);
    local_c8._16_4_ = local_138._16_4_;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
    local_a8[0] = 0xff;
    iVar11 = (*provider->_vptr_SigningProvider[4])();
    if (((char)iVar11 == '\0') ||
       (InferPubkey((anon_unknown_dwarf_145cfbe *)&local_e8.indirect_contents,(CPubKey *)local_a8,
                    ctx,provider),
       (Node<unsigned_int> *)local_e8.indirect_contents.indirect == (Node<unsigned_int> *)0x0))
    goto LAB_003906ed;
    std::
    make_unique<(anonymous_namespace)::PKHDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
              ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                *)&local_158);
    piVar7 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    *(pointer *)this = piVar7;
    std::
    unique_ptr<(anonymous_namespace)::PKHDescriptor,_std::default_delete<(anonymous_namespace)::PKHDescriptor>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKHDescriptor,_std::default_delete<(anonymous_namespace)::PKHDescriptor>_>
                   *)&local_158);
LAB_003907b9:
    if ((Node<unsigned_int> *)local_e8.indirect_contents.indirect != (Node<unsigned_int> *)0x0) {
      (*(*(_func_int ***)local_e8.indirect_contents.indirect)[1])();
    }
    goto LAB_0039144a;
  case MULTISIG:
switchD_00390535_caseD_5:
    if ((ctx < P2TR) && (ctx != P2WPKH)) {
      local_138._0_8_ = (Node<unsigned_int> *)0x0;
      local_138._8_8_ = (Node<unsigned_int> *)0x0;
      local_138._16_8_ = (Node<unsigned_int> *)0x0;
      bVar9 = true;
      uVar17 = 1;
      lVar15 = 0x20;
      do {
        uVar17 = uVar17 + 1;
        if ((ulong)(((long)local_178.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_178.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
            uVar17) break;
        CPubKey::Set<unsigned_char_const*>
                  ((CPubKey *)local_a8,
                   *(uchar **)
                    ((long)local_178.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8),
                   *(uchar **)
                    ((long)&((local_178.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar15));
        InferPubkey((anon_unknown_dwarf_145cfbe *)&local_c8._M_value,(CPubKey *)local_a8,ctx,
                    provider);
        uVar14 = local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((Node<unsigned_int> *)
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0) {
          bVar9 = false;
        }
        else {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
          ::
          emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                    ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                      *)&local_138._M_first,
                     (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      *)&local_c8._M_value);
        }
        if ((Node<unsigned_int> *)
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (Node<unsigned_int> *)0x0) {
          (*(*(_func_int ***)
              &((local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Tuple_impl<0UL,_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
               ).
               super__Tuple_impl<1UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
            )[1])();
        }
        lVar15 = lVar15 + 0x18;
      } while ((Node<unsigned_int> *)uVar14 != (Node<unsigned_int> *)0x0);
      if (bVar9) {
        bVar2 = *((local_178.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        this_01 = (MultisigDescriptor *)operator_new(0x60);
        local_a8._0_8_ = local_138._0_8_;
        local_a8._8_8_ = local_138._8_8_;
        local_a8._16_8_ = local_138._16_8_;
        local_138._0_8_ = (Node<unsigned_int> *)0x0;
        local_138._8_8_ = (Node<unsigned_int> *)0x0;
        local_138._16_8_ = (Node<unsigned_int> *)0x0;
        MultisigDescriptor::MultisigDescriptor
                  (this_01,(uint)bVar2,
                   (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    *)local_a8,false);
        local_c8._M_value.
        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                   *)local_a8);
        local_c8._M_value.
        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(MultisigDescriptor **)this = this_01;
        std::
        unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
                       *)&local_c8._M_value);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                   *)&local_138._M_first);
        goto LAB_0039144a;
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)&local_138._M_first);
    }
    break;
  case WITNESS_V0_KEYHASH:
switchD_00390535_caseD_8:
    if (ctx < P2WPKH) {
LAB_00390702:
      puVar5 = ((local_178.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)((local_178.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar5 != 0x14) goto LAB_003914ac;
      memcpy(&local_138,puVar5,0x14);
      local_c8._16_4_ = local_138._16_4_;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
      local_a8[0] = 0xff;
      iVar11 = (*provider->_vptr_SigningProvider[4])();
      if (((char)iVar11 != '\0') &&
         (InferPubkey((anon_unknown_dwarf_145cfbe *)&local_e8.indirect_contents,(CPubKey *)local_a8,
                      P2WPKH,provider),
         (Node<unsigned_int> *)local_e8.indirect_contents.indirect != (Node<unsigned_int> *)0x0)) {
        std::
        make_unique<(anonymous_namespace)::WPKHDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                  ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)&local_158);
        piVar7 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        *(pointer *)this = piVar7;
        std::
        unique_ptr<(anonymous_namespace)::WPKHDescriptor,_std::default_delete<(anonymous_namespace)::WPKHDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::WPKHDescriptor,_std::default_delete<(anonymous_namespace)::WPKHDescriptor>_>
                       *)&local_158);
        goto LAB_003907b9;
      }
    }
LAB_003907d5:
    if (TVar10 == MULTISIG) goto switchD_00390535_caseD_5;
  }
  if (TVar10 == SCRIPTHASH && ctx == TOP) {
    puVar5 = ((local_178.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((local_178.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar5 != 0x14) {
LAB_003914ac:
      __assert_fail("vch.size() == WIDTH",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/uint256.h"
                    ,0x2a,"base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]");
    }
    memcpy(&local_138,puVar5,0x14);
    local_c8._16_4_ = local_138._16_4_;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
    local_c8._M_value.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
    local_a8._16_8_ = (Node<unsigned_int> *)0x0;
    local_a8._24_8_ = (Node<unsigned_int> *)0x0;
    local_a8._0_8_ = (Node<unsigned_int> *)0x0;
    local_a8._8_8_ = (Node<unsigned_int> *)0x0;
    iVar11 = (*provider->_vptr_SigningProvider[2])();
    if (((char)iVar11 == '\0') ||
       (InferScript((anon_unknown_dwarf_145cfbe *)&local_e8.indirect_contents,(CScript *)local_a8,
                    P2SH,provider),
       (Node<unsigned_int> *)local_e8.indirect_contents.indirect == (Node<unsigned_int> *)0x0)) {
      if (0x1c < (uint)local_a8._28_4_) {
        free((void *)local_a8._0_8_);
        local_a8._0_8_ = (Node<unsigned_int> *)0x0;
      }
      goto LAB_00390a98;
    }
    std::
    make_unique<(anonymous_namespace)::SHDescriptor,std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
              ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                *)&local_158);
    piVar7 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    *(pointer *)this = piVar7;
    std::
    unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
                   *)&local_158);
    uVar14 = local_e8.indirect_contents.indirect;
LAB_00390bac:
    if ((Node<unsigned_int> *)uVar14 != (Node<unsigned_int> *)0x0) {
      (*(*(_func_int ***)&((Node<unsigned_int> *)uVar14)->fragment)[1])();
    }
    if (0x1c < (uint)local_a8._28_4_) {
      free((void *)local_a8._0_8_);
      local_a8._0_8_ = (Node<unsigned_int> *)0x0;
    }
  }
  else {
LAB_00390a98:
    if (ctx < P2WPKH && TVar10 == WITNESS_V0_SCRIPTHASH) {
      data_00 = ((local_178.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 = ((local_178.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)local_c8._M_value.
                            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000)
      ;
      CRIPEMD160::CRIPEMD160((CRIPEMD160 *)local_a8);
      this_02 = CRIPEMD160::Write((CRIPEMD160 *)local_a8,data_00,(long)puVar5 - (long)data_00);
      CRIPEMD160::Finalize(this_02,local_c8.field2);
      local_138._0_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_138._8_8_ =
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_138._16_4_ = local_c8._16_4_;
      local_a8._16_8_ = (Node<unsigned_int> *)0x0;
      local_a8._24_8_ = (Node<unsigned_int> *)0x0;
      local_a8._0_8_ = (Node<unsigned_int> *)0x0;
      local_a8._8_8_ = (Node<unsigned_int> *)0x0;
      iVar11 = (*provider->_vptr_SigningProvider[2])();
      if (((char)iVar11 != '\0') &&
         (InferScript((anon_unknown_dwarf_145cfbe *)&local_c8._M_value,(CScript *)local_a8,P2WSH,
                      provider),
         (Node<unsigned_int> *)
         local_c8._M_value.
         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start != (Node<unsigned_int> *)0x0)) {
        std::
        make_unique<(anonymous_namespace)::WSHDescriptor,std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
                  ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                    *)&local_e8.indirect_contents);
        uVar14 = local_e8.indirect_contents.indirect;
        local_e8.indirect_contents.indirect = (char *)0x0;
        *(undefined8 *)this = uVar14;
        std::
        unique_ptr<(anonymous_namespace)::WSHDescriptor,_std::default_delete<(anonymous_namespace)::WSHDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::WSHDescriptor,_std::default_delete<(anonymous_namespace)::WSHDescriptor>_>
                       *)&local_e8.indirect_contents);
        uVar14 = local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00390bac;
      }
      if (0x1c < (uint)local_a8._28_4_) {
        free((void *)local_a8._0_8_);
        local_a8._0_8_ = (Node<unsigned_int> *)0x0;
      }
    }
    if (TVar10 == WITNESS_V1_TAPROOT && ctx == TOP) {
      local_138._16_8_ = (Node<unsigned_int> *)0x0;
      local_138._24_8_ = 0;
      local_138._0_8_ = (Node<unsigned_int> *)0x0;
      local_138._8_8_ = (Node<unsigned_int> *)0x0;
      puVar5 = ((local_178.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = (long)((local_178.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar5;
      if (__n != 0) {
        memmove(&local_138,puVar5,__n);
      }
      local_60._M_left = &local_60;
      local_60._M_color = P2WSH;
      local_60._M_parent = (_Base_ptr)0x0;
      local_a8._0_8_ = (Node<unsigned_int> *)0x0;
      local_a8._8_8_ = (Node<unsigned_int> *)0x0;
      local_a8._16_8_ = (Node<unsigned_int> *)0x0;
      local_a8._24_8_ = (Node<unsigned_int> *)0x0;
      local_a8._32_8_ = (pointer)0x0;
      local_a8._40_8_ = (pointer)0x0;
      local_a8._48_8_ = 0;
      auStack_70._0_8_ = 0;
      local_40 = 0;
      local_60._M_right = local_60._M_left;
      iVar11 = (*provider->_vptr_SigningProvider[8])(provider,&local_138,local_a8);
      if ((char)iVar11 == '\0') {
LAB_00390f79:
        bVar9 = XOnlyPubKey::IsFullyValid((XOnlyPubKey *)&local_138._M_first);
        if ((!bVar9) ||
           (InferXOnlyPubkey((XOnlyPubKey *)&local_c8._M_value,(ParseScriptContext)&local_138,
                             provider),
           (Node<unsigned_int> *)
           local_c8._M_value.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0)) {
          std::
          _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                       *)(auStack_70 + 8));
          goto LAB_00391010;
        }
        std::
        make_unique<(anonymous_namespace)::RawTRDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                  ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)&local_e8.indirect_contents);
        uVar14 = local_e8.indirect_contents.indirect;
        local_e8.indirect_contents.indirect = (char *)0x0;
        *(undefined8 *)this = uVar14;
        std::
        unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
                       *)&local_e8.indirect_contents);
        if ((Node<unsigned_int> *)
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (Node<unsigned_int> *)0x0) {
          (*(*(_func_int ***)
              &((local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Tuple_impl<0UL,_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
               ).
               super__Tuple_impl<1UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
            )[1])();
        }
      }
      else {
        InferTaprootTree((optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                          *)&local_c8._M_value,(TaprootSpendData *)local_a8,
                         (XOnlyPubKey *)&local_138._M_first);
        uVar14 = local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_b0 != '\x01') {
LAB_00390f5e:
          if (local_b0 == '\x01') {
            local_b0 = '\0';
            std::
            vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ::~vector(&local_c8._M_value);
          }
          goto LAB_00390f79;
        }
        local_198.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8 = (int *)0x0;
        local_1b8 = (PubkeyProvider *)0x0;
        iStack_1b0._M_current = (int *)0x0;
        if (local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __args = &((local_c8._M_value.
                      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Tuple_impl<0UL,_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                    ).super__Head_base<0UL,_int,_false>;
          bVar9 = true;
          do {
            local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            if ((((_Tuple_impl<0UL,_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                   *)(__args + -8))->
                super__Tuple_impl<1UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                ).super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl == 0xc0
               ) {
              prevector<28U,_unsigned_char,_unsigned_int,_int>::
              prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         &local_e8.indirect_contents,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(((_Head_base<1UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                              *)(__args + -6))->_M_head_impl).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )*(uchar **)(__args + -4));
              InferScript((anon_unknown_dwarf_145cfbe *)&local_140,
                          (CScript *)&local_e8.indirect_contents,P2TR,provider);
              local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_140._M_head_impl;
              local_140._M_head_impl = (PubkeyProvider *)0x0;
              if (0x1c < local_cc) {
                free(local_e8.indirect_contents.indirect);
                local_e8.indirect_contents.indirect = (char *)0x0;
              }
            }
            piVar7 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((PubkeyProvider *)
                local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == (PubkeyProvider *)0x0) {
              bVar9 = false;
            }
            else {
              std::
              vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>,std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>>
              ::
              emplace_back<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
                        ((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>,std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>>
                          *)&local_198,
                         (unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                          *)&local_158);
              if (iStack_1b0._M_current == local_1a8) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_1b8,iStack_1b0,
                           &__args->_M_head_impl);
              }
              else {
                *iStack_1b0._M_current = __args->_M_head_impl;
                iStack_1b0._M_current = iStack_1b0._M_current + 1;
              }
            }
            if ((PubkeyProvider *)
                local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (PubkeyProvider *)0x0) {
              (*(*(_func_int ***)
                  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start)[1])();
            }
          } while (((PubkeyProvider *)piVar7 != (PubkeyProvider *)0x0) &&
                  (piVar1 = &__args[2]._M_head_impl, __args = __args + 10, piVar1 != (int *)uVar14))
          ;
          if (!bVar9) {
            if (local_1b8 != (PubkeyProvider *)0x0) {
              operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
            }
            std::
            vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
            ::~vector(&local_198);
            goto LAB_00390f5e;
          }
        }
        InferXOnlyPubkey((XOnlyPubKey *)&local_1c0,(ParseScriptContext)local_a8,provider);
        this_03 = (TRDescriptor *)operator_new(0x70);
        local_140._M_head_impl = local_1c0;
        local_1c0 = (PubkeyProvider *)0x0;
        local_e8.indirect_contents.indirect =
             (char *)local_198.
                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        local_e8._8_8_ =
             local_198.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_e8._16_8_ =
             local_198.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_198.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)local_1b8;
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iStack_1b0._M_current;
        local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_1a8;
        local_1b8 = (PubkeyProvider *)0x0;
        iStack_1b0._M_current = (int *)0x0;
        local_1a8 = (int *)0x0;
        TRDescriptor::TRDescriptor
                  (this_03,(unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                            *)&local_140,
                   (vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                    *)&local_e8.indirect_contents,&local_158);
        local_1c8._M_head_impl = this_03;
        if ((PubkeyProvider *)
            local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (PubkeyProvider *)0x0) {
          operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ::~vector((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                   *)&local_e8.indirect_contents);
        if (local_140._M_head_impl != (PubkeyProvider *)0x0) {
          (*(local_140._M_head_impl)->_vptr_PubkeyProvider[1])();
        }
        local_1c8._M_head_impl = (TRDescriptor *)0x0;
        *(TRDescriptor **)this = this_03;
        std::
        unique_ptr<(anonymous_namespace)::TRDescriptor,_std::default_delete<(anonymous_namespace)::TRDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::TRDescriptor,_std::default_delete<(anonymous_namespace)::TRDescriptor>_>
                       *)&local_1c8);
        if (local_1b8 != (PubkeyProvider *)0x0) {
          operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
        }
        std::
        vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
        ::~vector(&local_198);
        if (local_b0 != '\0') {
          local_b0 = '\0';
          std::
          vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ::~vector(&local_c8._M_value);
        }
      }
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                   *)(auStack_70 + 8));
    }
    else {
LAB_00391010:
      if (ctx - P2WSH < 2) {
        uVar14 = (Node<unsigned_int> *)0x0;
        local_60._M_color = (_Rb_tree_color)(ctx != P2WSH);
        local_a8._0_8_ = (Node<unsigned_int> *)0x0;
        local_a8._16_8_ = (Node<unsigned_int> *)0x0;
        local_a8._24_8_ = (Node<unsigned_int> *)0x0;
        local_a8._32_8_ = (pointer)0x0;
        local_a8._48_8_ = 0;
        auStack_70._0_8_ = auStack_70._0_8_ & 0xffffffffffffff00;
        local_60._4_4_ = 0;
        uVar3 = (script->super_CScriptBase)._size;
        uVar13 = 0xe10;
        if (ctx != P2WSH) {
          uVar13 = 0x5070a;
        }
        uVar6 = uVar3 - 0x1d;
        if (uVar3 < 0x1d) {
          uVar6 = uVar3;
        }
        uVar16 = (Node<unsigned_int> *)0x0;
        local_a8._8_8_ = provider;
        local_a8._40_8_ = auStack_70;
        if (uVar6 <= uVar13) {
          miniscript::internal::DecomposeScript
                    ((optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      *)&local_138._M_first,script);
          if (local_138._M_first._M_storage._M_storage[0x18] == '\x01') {
            local_e8.indirect_contents.indirect = (char *)local_138._0_8_;
            miniscript::internal::
            DecodeScript<unsigned_int,(anonymous_namespace)::KeyParser,__gnu_cxx::__normal_iterator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>*,std::vector<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                      ((internal *)&local_c8._M_value,
                       (__normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        *)&local_e8.indirect_contents,
                       (__normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        )local_138._8_8_,(KeyParser *)local_a8);
            uVar16 = local_c8._M_value.
                     super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar14 = local_c8._M_value.
                     super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((Node<unsigned_int> *)
                 local_c8._M_value.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == (Node<unsigned_int> *)0x0) ||
               (local_e8.indirect_contents.indirect != (char *)local_138._8_8_)) {
              uVar14 = (Node<unsigned_int> *)0x0;
              uVar16 = (Node<unsigned_int> *)0x0;
            }
            else {
              local_c8._M_value.
              super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_c8._M_value.
              super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            }
            if ((Node<unsigned_int> *)
                local_c8._M_value.
                super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (Node<unsigned_int> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_c8._M_value.
                         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          else {
            uVar14 = (Node<unsigned_int> *)0x0;
            uVar16 = (Node<unsigned_int> *)0x0;
          }
          if (local_138._M_first._M_storage._M_storage[0x18] == '\x01') {
            local_138._24_8_ = local_138._24_8_ & 0xffffffffffffff00;
            std::
            vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::~vector((vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)&local_138._M_first);
          }
        }
        if (((Node<unsigned_int> *)uVar14 != (Node<unsigned_int> *)0x0) &&
           (bVar9 = miniscript::Node<unsigned_int>::IsSane((Node<unsigned_int> *)uVar14), bVar9)) {
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ::reserve((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     *)&local_c8._M_value,
                    ((long)(local_a8._24_8_ - local_a8._16_8_) >> 3) * -0x5555555555555555);
          uVar8 = local_a8._24_8_;
          if (local_a8._16_8_ != local_a8._24_8_) {
            pNVar18 = (Node<unsigned_int> *)local_a8._16_8_;
            do {
              if ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                   *)(pNVar18->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start ==
                  (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                   *)*(_func_int ***)pNVar18) {
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00391ac0;
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
                goto LAB_003914ac;
              }
              std::
              vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
              ::
              emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                        ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                          *)&local_c8._M_value,
                         (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                          *)*(_func_int ***)pNVar18);
              pNVar18 = (Node<unsigned_int> *)
                        &(pNVar18->keys).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            } while (pNVar18 != (Node<unsigned_int> *)uVar8);
          }
          this_04 = (MiniscriptDescriptor *)operator_new(0x68);
          local_138._0_8_ =
               local_c8._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_138._8_8_ =
               local_c8._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_138._16_8_ =
               local_c8._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_e8.indirect_contents.indirect = (char *)uVar14;
          local_e8._8_8_ = uVar16;
          MiniscriptDescriptor::MiniscriptDescriptor
                    (this_04,(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                              *)&local_138._M_first,(NodeRef<uint32_t> *)&local_e8.indirect_contents
                    );
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this_04;
          if ((Node<unsigned_int> *)local_e8._8_8_ != (Node<unsigned_int> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          }
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     *)&local_138._M_first);
          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          *(MiniscriptDescriptor **)this = this_04;
          std::
          unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,_std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,_std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>_>
                         *)&local_158);
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     *)&local_c8._M_value);
          if ((undefined1 *)local_a8._40_8_ != auStack_70) {
            operator_delete((void *)local_a8._40_8_,auStack_70._0_8_ + 1);
          }
          std::
          vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
          ::~vector((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                     *)(local_a8 + 0x10));
          goto LAB_0039144a;
        }
        if ((Node<unsigned_int> *)uVar16 != (Node<unsigned_int> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar16);
        }
        if ((undefined1 *)local_a8._40_8_ != auStack_70) {
          operator_delete((void *)local_a8._40_8_,auStack_70._0_8_ + 1);
        }
        std::
        vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
        ::~vector((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                   *)(local_a8 + 0x10));
      }
      if (ctx == TOP) {
        local_138._16_8_ = (Node<unsigned_int> *)0x0;
        local_138._24_8_ = 0;
        local_138._0_8_ = (Node<unsigned_int> *)0x0;
        local_138._8_8_ = (Node<unsigned_int> *)0x0;
        local_f0 = 0;
        bVar9 = ExtractDestination(script,(CTxDestination *)&local_138._M_first);
        if (bVar9) {
          GetScriptForDestination((CScript *)local_a8,(CTxDestination *)&local_138._M_first);
          bVar9 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
                             &script->super_CScriptBase);
          if (0x1c < (uint)local_a8._28_4_) {
            free((void *)local_a8._0_8_);
            local_a8._0_8_ = (Node<unsigned_int> *)0x0;
          }
          if (!bVar9) goto LAB_003913cd;
          this_05 = (AddressDescriptor *)operator_new(0xa8);
          std::__detail::__variant::
          _Move_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::_Move_ctor_base((_Move_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)local_a8,
                            (_Move_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_138._M_first);
          AddressDescriptor::AddressDescriptor(this_05,(CTxDestination *)local_a8);
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)this_05;
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_a8);
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(AddressDescriptor **)this = this_05;
          std::
          unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
                         *)&local_c8._M_value);
        }
        else {
LAB_003913cd:
          this_06 = (RawDescriptor *)operator_new(0x78);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
                     &script->super_CScriptBase);
          RawDescriptor::RawDescriptor(this_06,(CScript *)local_a8);
          if (0x1c < (uint)local_a8._28_4_) {
            local_c8._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)this_06;
            free((void *)local_a8._0_8_);
            local_a8._0_8_ = (Node<unsigned_int> *)0x0;
          }
          local_c8._M_value.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(RawDescriptor **)this = this_06;
          std::
          unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
                         *)&local_c8._M_value);
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_138._M_first);
      }
      else {
        *(undefined8 *)this = 0;
      }
    }
  }
LAB_0039144a:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_178);
LAB_00391457:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )this;
  }
LAB_00391ac0:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> InferScript(const CScript& script, ParseScriptContext ctx, const SigningProvider& provider)
{
    if (ctx == ParseScriptContext::P2TR && script.size() == 34 && script[0] == 32 && script[33] == OP_CHECKSIG) {
        XOnlyPubKey key{Span{script}.subspan(1, 32)};
        return std::make_unique<PKDescriptor>(InferXOnlyPubkey(key, ctx, provider), true);
    }

    if (ctx == ParseScriptContext::P2TR) {
        auto ret = InferMultiA(script, ctx, provider);
        if (ret) return ret;
    }

    std::vector<std::vector<unsigned char>> data;
    TxoutType txntype = Solver(script, data);

    if (txntype == TxoutType::PUBKEY && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        CPubKey pubkey(data[0]);
        if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
            return std::make_unique<PKDescriptor>(std::move(pubkey_provider));
        }
    }
    if (txntype == TxoutType::PUBKEYHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        uint160 hash(data[0]);
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (provider.GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
                return std::make_unique<PKHDescriptor>(std::move(pubkey_provider));
            }
        }
    }
    if (txntype == TxoutType::WITNESS_V0_KEYHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH)) {
        uint160 hash(data[0]);
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (provider.GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ParseScriptContext::P2WPKH, provider)) {
                return std::make_unique<WPKHDescriptor>(std::move(pubkey_provider));
            }
        }
    }
    if (txntype == TxoutType::MULTISIG && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        bool ok = true;
        std::vector<std::unique_ptr<PubkeyProvider>> providers;
        for (size_t i = 1; i + 1 < data.size(); ++i) {
            CPubKey pubkey(data[i]);
            if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
                providers.push_back(std::move(pubkey_provider));
            } else {
                ok = false;
                break;
            }
        }
        if (ok) return std::make_unique<MultisigDescriptor>((int)data[0][0], std::move(providers));
    }
    if (txntype == TxoutType::SCRIPTHASH && ctx == ParseScriptContext::TOP) {
        uint160 hash(data[0]);
        CScriptID scriptid(hash);
        CScript subscript;
        if (provider.GetCScript(scriptid, subscript)) {
            auto sub = InferScript(subscript, ParseScriptContext::P2SH, provider);
            if (sub) return std::make_unique<SHDescriptor>(std::move(sub));
        }
    }
    if (txntype == TxoutType::WITNESS_V0_SCRIPTHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH)) {
        CScriptID scriptid{RIPEMD160(data[0])};
        CScript subscript;
        if (provider.GetCScript(scriptid, subscript)) {
            auto sub = InferScript(subscript, ParseScriptContext::P2WSH, provider);
            if (sub) return std::make_unique<WSHDescriptor>(std::move(sub));
        }
    }
    if (txntype == TxoutType::WITNESS_V1_TAPROOT && ctx == ParseScriptContext::TOP) {
        // Extract x-only pubkey from output.
        XOnlyPubKey pubkey;
        std::copy(data[0].begin(), data[0].end(), pubkey.begin());
        // Request spending data.
        TaprootSpendData tap;
        if (provider.GetTaprootSpendData(pubkey, tap)) {
            // If found, convert it back to tree form.
            auto tree = InferTaprootTree(tap, pubkey);
            if (tree) {
                // If that works, try to infer subdescriptors for all leaves.
                bool ok = true;
                std::vector<std::unique_ptr<DescriptorImpl>> subscripts; //!< list of script subexpressions
                std::vector<int> depths; //!< depth in the tree of each subexpression (same length subscripts)
                for (const auto& [depth, script, leaf_ver] : *tree) {
                    std::unique_ptr<DescriptorImpl> subdesc;
                    if (leaf_ver == TAPROOT_LEAF_TAPSCRIPT) {
                        subdesc = InferScript(CScript(script.begin(), script.end()), ParseScriptContext::P2TR, provider);
                    }
                    if (!subdesc) {
                        ok = false;
                        break;
                    } else {
                        subscripts.push_back(std::move(subdesc));
                        depths.push_back(depth);
                    }
                }
                if (ok) {
                    auto key = InferXOnlyPubkey(tap.internal_key, ParseScriptContext::P2TR, provider);
                    return std::make_unique<TRDescriptor>(std::move(key), std::move(subscripts), std::move(depths));
                }
            }
        }
        // If the above doesn't work, construct a rawtr() descriptor with just the encoded x-only pubkey.
        if (pubkey.IsFullyValid()) {
            auto key = InferXOnlyPubkey(pubkey, ParseScriptContext::P2TR, provider);
            if (key) {
                return std::make_unique<RawTRDescriptor>(std::move(key));
            }
        }
    }

    if (ctx == ParseScriptContext::P2WSH || ctx == ParseScriptContext::P2TR) {
        const auto script_ctx{ctx == ParseScriptContext::P2WSH ? miniscript::MiniscriptContext::P2WSH : miniscript::MiniscriptContext::TAPSCRIPT};
        KeyParser parser(/* out = */nullptr, /* in = */&provider, /* ctx = */script_ctx);
        auto node = miniscript::FromScript(script, parser);
        if (node && node->IsSane()) {
            std::vector<std::unique_ptr<PubkeyProvider>> keys;
            keys.reserve(parser.m_keys.size());
            for (auto& key : parser.m_keys) {
                keys.emplace_back(std::move(key.at(0)));
            }
            return std::make_unique<MiniscriptDescriptor>(std::move(keys), std::move(node));
        }
    }

    // The following descriptors are all top-level only descriptors.
    // So if we are not at the top level, return early.
    if (ctx != ParseScriptContext::TOP) return nullptr;

    CTxDestination dest;
    if (ExtractDestination(script, dest)) {
        if (GetScriptForDestination(dest) == script) {
            return std::make_unique<AddressDescriptor>(std::move(dest));
        }
    }

    return std::make_unique<RawDescriptor>(script);
}